

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

LY_ERR lyd_compare_siblings_
                 (lyd_node *node1,lyd_node *node2,uint32_t options,ly_bool parental_schemas_checked)

{
  ushort uVar1;
  lysc_node *plVar2;
  lyd_node *plVar3;
  LY_ERR ret__;
  LY_ERR LVar4;
  lyd_node *in_RAX;
  bool bVar5;
  bool bVar6;
  lyd_node *iter2;
  lyd_node *local_38;
  
  bVar5 = node1 != (lyd_node *)0x0;
  bVar6 = node2 != (lyd_node *)0x0;
  if (bVar5 && bVar6) {
    local_38 = in_RAX;
    do {
      LVar4 = lyd_compare_single_schema(node1,node2,options,parental_schemas_checked);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      plVar2 = node1->schema;
      plVar3 = node2;
      if (plVar2 != (lysc_node *)0x0) {
        if (plVar2->nodetype == 8) {
          uVar1 = plVar2->flags;
          plVar3 = node2;
          if ((uVar1 & 1) != 0) {
LAB_00121e1e:
            plVar3 = node2;
            if ((char)uVar1 < '\0') {
              LVar4 = lyd_find_sibling_first(node2,node1,&local_38);
              if (LVar4 == LY_ENOTFOUND) {
                LVar4 = LY_ENOT;
              }
              plVar3 = local_38;
              if (LVar4 != LY_SUCCESS) {
                return LVar4;
              }
            }
          }
        }
        else {
          plVar3 = node2;
          if ((plVar2->nodetype == 0x10) &&
             (uVar1 = plVar2->flags, plVar3 = node2, (uVar1 >> 9 & 1) == 0)) goto LAB_00121e1e;
        }
      }
      local_38 = plVar3;
      LVar4 = lyd_compare_single_data(node1,local_38,options | 1);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      node1 = node1->next;
      node2 = node2->next;
      bVar6 = node2 != (lyd_node *)0x0;
      bVar5 = node1 != (lyd_node *)0x0;
    } while ((bVar5) && (node2 != (lyd_node *)0x0));
  }
  LVar4 = LY_ENOT;
  if (!bVar5 && !bVar6) {
    LVar4 = LY_SUCCESS;
  }
  return LVar4;
}

Assistant:

static LY_ERR
lyd_compare_siblings_(const struct lyd_node *node1, const struct lyd_node *node2, uint32_t options,
        ly_bool parental_schemas_checked)
{
    LY_ERR r;
    const struct lyd_node *iter2;

    while (node1 && node2) {
        /* schema match */
        r = lyd_compare_single_schema(node1, node2, options, parental_schemas_checked);
        LY_CHECK_RET(r);

        if (node1->schema && (((node1->schema->nodetype == LYS_LIST) && !(node1->schema->flags & LYS_KEYLESS)) ||
                ((node1->schema->nodetype == LYS_LEAFLIST) && (node1->schema->flags & LYS_CONFIG_W))) &&
                (node1->schema->flags & LYS_ORDBY_SYSTEM)) {
            /* find a matching instance in case they are ordered differently */
            r = lyd_find_sibling_first(node2, node1, (struct lyd_node **)&iter2);
            if (r == LY_ENOTFOUND) {
                /* no matching instance, data not equal */
                r = LY_ENOT;
            }
            LY_CHECK_RET(r);
        } else {
            /* compare with the current node */
            iter2 = node2;
        }

        /* data match */
        r = lyd_compare_single_data(node1, iter2, options | LYD_COMPARE_FULL_RECURSION);
        LY_CHECK_RET(r);

        node1 = node1->next;
        node2 = node2->next;
    }

    return (node1 || node2) ? LY_ENOT : LY_SUCCESS;
}